

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::CheckForStaleTipAndEvictPeers(PeerManagerImpl *this)

{
  long lVar1;
  seconds t;
  string_view source_file;
  string_view logging_function;
  strong_ordering sVar2;
  bool bVar3;
  duration<long,_std::ratio<1L,_1L>_> dVar4;
  type tVar5;
  long in_RDI;
  long in_FS_OFFSET;
  Level in_stack_000000c0;
  duration<long,_std::ratio<1L,_1L>_> now;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock110;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff20;
  PeerManagerImpl *in_stack_ffffffffffffff28;
  duration<long,_std::ratio<60L,_1L>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  CConnman *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff8c;
  CValidationInterface in_stack_ffffffffffffffa8;
  ConstevalFormatString<1U> in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  duration<long,_std::ratio<1L,_1L>_> dVar7;
  char *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,
                               CONCAT15(in_stack_ffffffffffffff5d,
                                        CONCAT14(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                )))),in_stack_ffffffffffffff50,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
             SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
  dVar4 = GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  dVar7 = dVar4;
  EvictExtraOutboundPeers
            ((PeerManagerImpl *)in_stack_ffffffffffffffa8._vptr_CValidationInterface,
             (seconds)now.__r);
  sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff30,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff28);
  uVar6 = CONCAT13(sVar2._M_value,(int3)in_stack_ffffffffffffff80);
  std::__cmp_cat::__unspec::__unspec
            ((__unspec *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (__unspec *)0x1061363);
  bVar3 = std::operator>((char)((uint)uVar6 >> 0x18));
  if (bVar3) {
    bVar3 = ::node::BlockManager::LoadingBlocks((BlockManager *)in_stack_ffffffffffffff28);
    if ((((bVar3) ||
         (bVar3 = CConnman::GetNetworkActive
                            ((CConnman *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)), !bVar3)
         ) || (bVar3 = CConnman::GetUseAddrmanOutgoing
                                 ((CConnman *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
              !bVar3)) ||
       (bVar3 = TipMayBeStale((PeerManagerImpl *)
                              CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)), !bVar3
       )) {
      bVar3 = CConnman::GetTryNewOutboundPeer
                        ((CConnman *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (bVar3) {
        CConnman::SetTryNewOutboundPeer
                  (in_stack_ffffffffffffff40,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (char *)in_stack_ffffffffffffff30);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (char *)in_stack_ffffffffffffff30);
      std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::load
                ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (memory_order)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      std::chrono::operator-
                ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      t.__r._4_4_ = in_stack_ffffffffffffff1c;
      t.__r._0_4_ = in_stack_ffffffffffffff18;
      count_seconds(t);
      in_stack_ffffffffffffff28 = (PeerManagerImpl *)&stack0xffffffffffffffa8;
      in_stack_ffffffffffffff18 = 2;
      logging_function._M_str = in_stack_ffffffffffffffe8;
      logging_function._M_len = dVar7.__r;
      source_file._M_str = (char *)dVar4.__r;
      source_file._M_len = in_stack_ffffffffffffffd0;
      LogPrintFormatInternal<long>
                (logging_function,source_file,in_stack_ffffffffffffff8c,
                 CONCAT44(in_stack_ffffffffffffff84,uVar6),in_stack_000000c0,
                 in_stack_ffffffffffffffc8,(long *)criticalblock110.super_unique_lock._M_device);
      CConnman::SetTryNewOutboundPeer
                (in_stack_ffffffffffffff40,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
    }
    tVar5 = std::chrono::operator+
                      ((duration<long,_std::ratio<1L,_1L>_> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff30);
    *(rep *)(in_RDI + 0x170) = tVar5.__r;
  }
  if ((*(byte *)(in_RDI + 0x214) & 1) == 0) {
    bVar3 = CanDirectFetch(in_stack_ffffffffffffff28);
    if (bVar3) {
      CConnman::StartExtraBlockRelayPeers
                ((CConnman *)
                 CONCAT44(CONCAT13(bVar3,(int3)in_stack_ffffffffffffff3c),in_stack_ffffffffffffff38)
                );
      *(undefined1 *)(in_RDI + 0x214) = 1;
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::CheckForStaleTipAndEvictPeers()
{
    LOCK(cs_main);

    auto now{GetTime<std::chrono::seconds>()};

    EvictExtraOutboundPeers(now);

    if (now > m_stale_tip_check_time) {
        // Check whether our tip is stale, and if so, allow using an extra
        // outbound peer
        if (!m_chainman.m_blockman.LoadingBlocks() && m_connman.GetNetworkActive() && m_connman.GetUseAddrmanOutgoing() && TipMayBeStale()) {
            LogPrintf("Potential stale tip detected, will try using extra outbound peer (last tip update: %d seconds ago)\n",
                      count_seconds(now - m_last_tip_update.load()));
            m_connman.SetTryNewOutboundPeer(true);
        } else if (m_connman.GetTryNewOutboundPeer()) {
            m_connman.SetTryNewOutboundPeer(false);
        }
        m_stale_tip_check_time = now + STALE_CHECK_INTERVAL;
    }

    if (!m_initial_sync_finished && CanDirectFetch()) {
        m_connman.StartExtraBlockRelayPeers();
        m_initial_sync_finished = true;
    }
}